

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  pointer pcVar1;
  cmRuntimeDependencyArchive *this_00;
  string *psVar2;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *this_01;
  bool bVar3;
  int iVar4;
  Status *pSVar5;
  uv_loop_t *loop;
  cmUVProcessChain process;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string line;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream output;
  undefined1 local_4b0 [16];
  StdioConfiguration local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  string local_468;
  string *local_448;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *local_440;
  undefined1 local_438 [112];
  ios_base local_3c8 [152];
  char *local_330;
  cmUVProcessChainBuilder local_230;
  undefined1 local_1d0 [16];
  cmBasicUVStreambuf<char,_std::char_traits<char>_> local_1c0;
  uv_handle_ptr_base_<uv_pipe_s> local_148;
  undefined8 local_138 [33];
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_230);
  cmUVProcessChainBuilder::SetBuiltinStream(&local_230,Stream_OUTPUT);
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  pcVar1 = local_438 + 0x10;
  local_438._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"objdump","");
  bVar3 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_438,&local_488);
  if ((pointer)local_438._0_8_ != pcVar1) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (!bVar3) {
    local_438._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Could not find objdump","")
    ;
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,(string *)local_438);
    if ((pointer)local_438._0_8_ != pcVar1) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    bVar3 = false;
    goto LAB_006406d0;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_488,
             (char (*) [3])"-p");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_488,file);
  cmUVProcessChainBuilder::AddCommand(&local_230,&local_488);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_4b0);
  bVar3 = cmUVProcessChain::Valid((cmUVProcessChain *)local_4b0);
  if (bVar3) {
    pSVar5 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_4b0,0);
    if (pSVar5->SpawnResult != 0) goto LAB_006405d3;
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
        ::regex == '\0') {
      iVar4 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::regex);
      if (iVar4 != 0) {
        GetFileInfo::regex.regmust = (char *)0x0;
        GetFileInfo::regex.program = (char *)0x0;
        GetFileInfo::regex.progsize = 0;
        memset(&GetFileInfo::regex,0,0x20a);
        cmsys::RegularExpression::compile
                  (&GetFileInfo::regex,"^[\t ]*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,&__dso_handle)
        ;
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
    }
    local_448 = file;
    local_440 = &this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool;
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_4b0);
    iVar4 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_4b0);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1d0,loop,iVar4);
    while( true ) {
      bVar3 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_1d0,&local_468,(bool *)0x0,0xffffffffffffffff);
      if (!bVar3) break;
      memset((RegularExpressionMatch *)local_438,0,0x208);
      bVar3 = cmsys::RegularExpression::find
                        (&GetFileInfo::regex,local_468._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_438);
      if (bVar3) {
        if ((char *)local_438._8_8_ == (char *)0x0) {
          local_4b0._8_8_ = &local_498;
          local_4a0.Type = None;
          local_4a0.FileDescriptor = 0;
          local_498 = 0;
        }
        else {
          local_4b0._8_8_ = &local_498;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_4b0 + 8),local_438._8_8_,local_330);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4b0 + 8));
        if ((undefined1 *)local_4b0._8_8_ != &local_498) {
          operator_delete((void *)local_4b0._8_8_,CONCAT71(uStack_497,local_498) + 1);
        }
      }
    }
    bVar3 = cmUVProcessChain::Wait((cmUVProcessChain *)local_4b0,0);
    this_01 = local_440;
    psVar2 = local_448;
    if (bVar3) {
      pSVar5 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_4b0,0);
      if (pSVar5->ExitStatus != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"Failed to run objdump on:\n  ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,(string *)(local_4b0 + 8));
        goto LAB_00640927;
      }
      bVar3 = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,"Failed to wait on objdump process for:\n  ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,(string *)(local_4b0 + 8));
LAB_00640927:
      if ((undefined1 *)local_4b0._8_8_ != &local_498) {
        operator_delete((void *)local_4b0._8_8_,CONCAT71(uStack_497,local_498) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      bVar3 = false;
    }
    local_1d0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_138[0] = 0xb466e8;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_148);
    local_1d0._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_138[0] = 0xb46768;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf(&local_1c0);
    local_1d0._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_138[0] = 0xb467d0;
    local_1d0._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,
                      CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                               local_468.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
LAB_006405d3:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,"Failed to start objdump process for:\n  ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__cxx11::stringbuf::str();
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,(string *)local_1d0);
    if ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    bVar3 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_4b0);
LAB_006406d0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.WorkingDirectory._M_dataplus._M_p != &local_230.WorkingDirectory.field_2) {
    operator_delete(local_230.WorkingDirectory._M_dataplus._M_p,
                    local_230.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_230.Processes);
  return bVar3;
}

Assistant:

bool cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^[\t ]*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (cmSystemTools::GetLineFromStream(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}